

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_gc.c
# Opt level: O0

void zt_gc_collect(zt_gc_t *gc,int full_scan)

{
  undefined8 uVar1;
  int iVar2;
  int in_ESI;
  int *in_RDI;
  zt_gc_collectable_t *mark;
  zt_elist_t *elt;
  zt_elist_t *next;
  int current_marks;
  zt_gc_t *mark_00;
  zt_gc_t *in_stack_ffffffffffffffe0;
  int local_10;
  
  local_10 = 0;
  if ((-1 < *in_RDI) && ((in_ESI != 0 || (in_RDI[3] <= in_RDI[1])))) {
    *in_RDI = *in_RDI + -1;
    in_RDI[1] = 0;
    if (*(long *)(in_RDI + 0x1c) == *(long *)(in_RDI + 0x18)) {
      *(undefined8 *)(in_RDI + 0x1c) = *(undefined8 *)(*(long *)(in_RDI + 0x1c) + 8);
    }
    do {
      if (*(long *)(in_RDI + 0x1c) == *(long *)(in_RDI + 0x18)) {
        *in_RDI = *in_RDI + 1;
        zt_gc_switch(in_stack_ffffffffffffffe0);
        return;
      }
      mark_00 = *(zt_gc_t **)(in_RDI + 0x1c);
      in_stack_ffffffffffffffe0 = mark_00;
      (**(code **)(in_RDI + 6))(mark_00);
      (**(code **)(in_RDI + 0x20))(in_RDI,*(undefined8 *)(in_RDI + 0x1e),in_stack_ffffffffffffffe0);
      uVar1 = *(undefined8 *)(*(long *)(in_RDI + 0x1c) + 8);
      iVar2 = is_protected((zt_gc_collectable_t *)mark_00);
      if (iVar2 == 0) {
        zt_elist_remove((zt_elist_t *)0x108c7a);
        zt_elist_add((zt_elist_t *)in_stack_ffffffffffffffe0,(zt_elist_t *)mark_00);
      }
      *(undefined8 *)(in_RDI + 0x1c) = uVar1;
    } while (((in_ESI != 0) || (local_10 = local_10 + 1, local_10 < in_RDI[2])) ||
            (*(long *)(in_RDI + 0x1c) == *(long *)(in_RDI + 0x18)));
    *in_RDI = *in_RDI + 1;
  }
  return;
}

Assistant:

void
zt_gc_collect(zt_gc_t *gc, int full_scan)
{
    int current_marks = 0;

    if (gc->enabled < 0 ||
        (!full_scan && gc->current_allocs < gc->allocs_before_scan)) {
        return;
    }

    gc->enabled--;

#if DEBUG_SCAN
    printf("\n== Start Scan ==\n");
    zt_gc_print_heap(gc);
#endif /* DEBUG_SCAN */

    gc->current_allocs = 0;

    if (gc->scan == gc->grey) {
        /* beginning of a scan */
        gc->scan = gc->scan->next;
    }

    while (gc->scan != gc->grey) {
        /* move thru each object in the grey list moving it to the
         * black list and marking it as we go.
         */
        zt_elist_t          * next;
        zt_elist_t          * elt;
        zt_gc_collectable_t * mark;

        elt = gc->scan;

        mark = zt_elist_data(elt, zt_gc_collectable_t, list);

        gc->clear_white(mark);
        gc->mark_fn(gc, gc->private_data, elt);

        next = gc->scan->next;

        if (!is_protected(mark)) {
            /* if it is protected leave it in the grey list
             * otherwise move it to black
             */
            zt_elist_remove(elt);
            zt_elist_add(gc->black, elt);
        }

        gc->scan = next;

        if (!full_scan && ++current_marks >= gc->marks_per_scan) {
            if (gc->scan != gc->grey) {
                gc->enabled++;
#if DEBUG_SCAN
                printf("------\n");
                zt_gc_print_heap(gc);
                printf("== End Scan (Partial) ==\n\n");
#endif /* DEBUG_SCAN */
                return;
            }
        }
    }

    gc->enabled++;
#if DEBUG_SCAN
    printf("------\n");
    zt_gc_print_heap(gc);
    printf("== End Scan (Full) ==\n\n");
#endif /* DEBUG_SCAN */
    zt_gc_switch(gc);
}